

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

int scroll_menu_v_scroll_left_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  int scroll_border;
  Am_Widget_Look local_24;
  Am_Widget_Look look;
  Am_Object group;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe0,(Am_Slot_Flags)self);
  pAVar5 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_24,pAVar5);
  bVar1 = Am_Widget_Look::operator==(&local_24,&Am_MOTIF_LOOK);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe0,0x18d,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
  if (bVar2) {
    self_local._4_4_ = -(-(uint)bVar1 | 0xfffffffd);
  }
  else {
    pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe0,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(self,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    self_local._4_4_ = (iVar3 - iVar4) + (-(uint)bVar1 | 0xfffffffd);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, scroll_menu_v_scroll_left)
{
  Am_Object group = self.Get_Owner();
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int scroll_border = (look == Am_MOTIF_LOOK) ? -1 : -3;
  if ((bool)group.Get(Am_V_SCROLL_BAR_ON_LEFT))
    return -scroll_border;
  else // on right
    return (int)group.Get(Am_WIDTH) - (int)self.Get(Am_WIDTH) + scroll_border;
}